

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.c
# Opt level: O1

size_t FSE_decompress_usingDTable
                 (void *dst,size_t originalSize,void *cSrc,size_t cSrcSize,FSE_DTable *dt)

{
  undefined1 *puVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  FSE_DTable FVar5;
  FSE_DTable FVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong *puVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  undefined1 *puVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  bool bVar26;
  ulong *local_58;
  ulong *local_50;
  
  puVar1 = (undefined1 *)((long)dst + (originalSize - 3));
  local_58 = (ulong *)cSrc;
  if (*(short *)((long)dt + 2) == 0) {
    if (cSrcSize == 0) {
      cSrcSize = 0xffffffffffffffb8;
      uVar20 = 0;
      iVar14 = 0;
      puVar12 = (ulong *)0x0;
      local_58 = (ulong *)0x0;
      local_50 = (ulong *)0x0;
    }
    else {
      local_50 = (ulong *)((long)cSrc + 8);
      if (cSrcSize < 8) {
        uVar20 = (ulong)*cSrc;
        switch(cSrcSize) {
        case 7:
          uVar20 = uVar20 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
        case 6:
          uVar20 = uVar20 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
        case 5:
          uVar20 = uVar20 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
        case 4:
          uVar20 = uVar20 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
        case 3:
          uVar20 = uVar20 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
        case 2:
          uVar20 = uVar20 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
        default:
          bVar2 = *(byte *)((long)cSrc + (cSrcSize - 1));
          uVar15 = 0x1f;
          if (bVar2 != 0) {
            for (; bVar2 >> uVar15 == 0; uVar15 = uVar15 - 1) {
            }
          }
          puVar12 = (ulong *)cSrc;
          if (bVar2 == 0) {
            cSrcSize = 0xffffffffffffffec;
            iVar14 = 0;
          }
          else {
            iVar14 = ~uVar15 + (int)cSrcSize * -8 + 0x49;
          }
        }
      }
      else {
        puVar12 = (ulong *)((long)cSrc + (cSrcSize - 8));
        uVar20 = *puVar12;
        bVar2 = *(byte *)((long)cSrc + (cSrcSize - 1));
        uVar15 = 0x1f;
        if (bVar2 != 0) {
          for (; bVar2 >> uVar15 == 0; uVar15 = uVar15 - 1) {
          }
        }
        iVar14 = ~uVar15 + 9;
        if (bVar2 == 0) {
          iVar14 = 0;
        }
        cSrcSize = cSrcSize | -(ulong)(bVar2 == 0);
      }
    }
    if (0xffffffffffffff88 < cSrcSize) {
      return cSrcSize;
    }
    uVar4 = (ushort)*dt;
    uVar15 = iVar14 + (uint)uVar4;
    uVar21 = uVar20 >> (-(char)uVar15 & 0x3fU);
    iVar14 = (int)local_58;
    if (uVar15 < 0x41) {
      if (puVar12 < local_50) {
        if (puVar12 == local_58) goto LAB_00236c55;
        uVar18 = (int)puVar12 - iVar14;
        if (local_58 <= (ulong *)((long)puVar12 - (ulong)(uVar15 >> 3))) {
          uVar18 = uVar15 >> 3;
        }
        uVar15 = uVar15 + uVar18 * -8;
      }
      else {
        uVar18 = uVar15 >> 3;
        uVar15 = uVar15 & 7;
      }
      puVar12 = (ulong *)((long)puVar12 - (ulong)uVar18);
      uVar20 = *puVar12;
    }
LAB_00236c55:
    uVar15 = uVar15 + uVar4;
    uVar22 = (ulong)((uint)uVar21 & BIT_mask[uVar4]);
    uVar21 = (ulong)(BIT_mask[uVar4] & (uint)(uVar20 >> (-(char)uVar15 & 0x3fU)));
    if (uVar15 < 0x41) {
      if (puVar12 < local_50) {
        if (puVar12 == local_58) goto LAB_00236cae;
        uVar18 = (int)puVar12 - iVar14;
        if (local_58 <= (ulong *)((long)puVar12 - (ulong)(uVar15 >> 3))) {
          uVar18 = uVar15 >> 3;
        }
        uVar15 = uVar15 + uVar18 * -8;
      }
      else {
        uVar18 = uVar15 >> 3;
        uVar15 = uVar15 & 7;
      }
      puVar12 = (ulong *)((long)puVar12 - (ulong)uVar18);
      uVar20 = *puVar12;
    }
LAB_00236cae:
    lVar7 = 0;
    do {
      if (uVar15 < 0x41) {
        if (puVar12 < local_50) {
          if (puVar12 == local_58) goto LAB_00236cb9;
          bVar26 = local_58 <= (ulong *)((long)puVar12 - (ulong)(uVar15 >> 3));
          uVar18 = (int)puVar12 - iVar14;
          if (bVar26) {
            uVar18 = uVar15 >> 3;
          }
          uVar15 = uVar15 + uVar18 * -8;
        }
        else {
          uVar18 = uVar15 >> 3;
          uVar15 = uVar15 & 7;
          bVar26 = true;
        }
        puVar12 = (ulong *)((long)puVar12 - (ulong)uVar18);
        uVar20 = *puVar12;
      }
      else {
LAB_00236cb9:
        bVar26 = false;
      }
      puVar19 = (undefined1 *)((long)dst + lVar7);
      if ((puVar1 <= puVar19) || (!bVar26)) goto LAB_00236dcf;
      uVar23 = (ulong)(ushort)dt[uVar22 + 1];
      bVar2 = *(byte *)((long)dt + uVar22 * 4 + 7);
      iVar16 = uVar15 + bVar2;
      uVar24 = (ulong)((uint)(uVar20 >> (-(char)iVar16 & 0x3fU)) & BIT_mask[bVar2]);
      *puVar19 = *(undefined1 *)((long)dt + uVar22 * 4 + 6);
      bVar2 = *(byte *)((long)dt + uVar21 * 4 + 7);
      iVar16 = iVar16 + (uint)bVar2;
      uVar13 = (ulong)(ushort)dt[uVar21 + 1];
      uVar25 = (ulong)((uint)(uVar20 >> (-(char)iVar16 & 0x3fU)) & BIT_mask[bVar2]);
      puVar19[1] = *(undefined1 *)((long)dt + uVar21 * 4 + 6);
      lVar8 = uVar24 * 4;
      bVar2 = *(byte *)((long)dt + uVar23 * 4 + lVar8 + 7);
      iVar16 = iVar16 + (uint)bVar2;
      uVar18 = BIT_mask[bVar2];
      FVar5 = dt[uVar24 + uVar23 + 1];
      puVar19[2] = *(undefined1 *)((long)dt + uVar23 * 4 + lVar8 + 6);
      lVar8 = uVar25 * 4;
      bVar2 = *(byte *)((long)dt + uVar13 * 4 + lVar8 + 7);
      uVar15 = iVar16 + (uint)bVar2;
      uVar22 = (ulong)((uint)(uVar20 >> (-(char)iVar16 & 0x3fU)) & uVar18) + (ulong)(ushort)FVar5;
      uVar21 = (ulong)((uint)(uVar20 >> (-(char)uVar15 & 0x3fU)) & BIT_mask[bVar2]) +
               (ulong)(ushort)dt[uVar25 + uVar13 + 1];
      puVar19[3] = *(undefined1 *)((long)dt + uVar13 * 4 + lVar8 + 6);
      lVar7 = lVar7 + 4;
    } while( true );
  }
  if (cSrcSize == 0) {
    cSrcSize = 0xffffffffffffffb8;
    local_50 = (ulong *)0x0;
    local_58 = (ulong *)0x0;
    iVar14 = 0;
    uVar20 = 0;
    puVar12 = (ulong *)0x0;
  }
  else {
    local_50 = (ulong *)((long)cSrc + 8);
    if (cSrcSize < 8) {
      uVar20 = (ulong)*cSrc;
      switch(cSrcSize) {
      case 7:
        uVar20 = uVar20 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
      case 6:
        uVar20 = uVar20 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
      case 5:
        uVar20 = uVar20 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
      case 4:
        uVar20 = uVar20 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
      case 3:
        uVar20 = uVar20 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
      case 2:
        uVar20 = uVar20 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
      default:
        bVar2 = *(byte *)((long)cSrc + (cSrcSize - 1));
        uVar15 = 0x1f;
        if (bVar2 != 0) {
          for (; bVar2 >> uVar15 == 0; uVar15 = uVar15 - 1) {
          }
        }
        puVar12 = (ulong *)cSrc;
        if (bVar2 == 0) {
          cSrcSize = 0xffffffffffffffec;
          iVar14 = 0;
        }
        else {
          iVar14 = ~uVar15 + (int)cSrcSize * -8 + 0x49;
        }
      }
    }
    else {
      puVar12 = (ulong *)((long)cSrc + (cSrcSize - 8));
      uVar20 = *puVar12;
      bVar2 = *(byte *)((long)cSrc + (cSrcSize - 1));
      uVar15 = 0x1f;
      if (bVar2 != 0) {
        for (; bVar2 >> uVar15 == 0; uVar15 = uVar15 - 1) {
        }
      }
      iVar14 = ~uVar15 + 9;
      if (bVar2 == 0) {
        iVar14 = 0;
      }
      cSrcSize = cSrcSize | -(ulong)(bVar2 == 0);
    }
  }
  if (0xffffffffffffff88 < cSrcSize) {
    return cSrcSize;
  }
  uVar4 = (ushort)*dt;
  uVar15 = iVar14 + (uint)uVar4;
  uVar21 = uVar20 >> (-(char)uVar15 & 0x3fU);
  iVar14 = (int)local_58;
  if (uVar15 < 0x41) {
    if (puVar12 < local_50) {
      if (puVar12 == local_58) goto LAB_002368e4;
      uVar18 = (int)puVar12 - iVar14;
      if (local_58 <= (ulong *)((long)puVar12 - (ulong)(uVar15 >> 3))) {
        uVar18 = uVar15 >> 3;
      }
      uVar15 = uVar15 + uVar18 * -8;
    }
    else {
      uVar18 = uVar15 >> 3;
      uVar15 = uVar15 & 7;
    }
    puVar12 = (ulong *)((long)puVar12 - (ulong)uVar18);
    uVar20 = *puVar12;
  }
LAB_002368e4:
  uVar15 = uVar15 + uVar4;
  uVar22 = (ulong)((uint)uVar21 & BIT_mask[uVar4]);
  uVar21 = (ulong)(BIT_mask[uVar4] & (uint)(uVar20 >> (-(char)uVar15 & 0x3fU)));
  if (uVar15 < 0x41) {
    if (puVar12 < local_50) {
      if (puVar12 == local_58) goto LAB_0023694e;
      uVar18 = (int)puVar12 - iVar14;
      if (local_58 <= (ulong *)((long)puVar12 - (ulong)(uVar15 >> 3))) {
        uVar18 = uVar15 >> 3;
      }
      uVar15 = uVar15 + uVar18 * -8;
    }
    else {
      uVar18 = uVar15 >> 3;
      uVar15 = uVar15 & 7;
    }
    puVar12 = (ulong *)((long)puVar12 - (ulong)uVar18);
    uVar20 = *puVar12;
  }
LAB_0023694e:
  lVar7 = 0;
  do {
    if (uVar15 < 0x41) {
      if (puVar12 < local_50) {
        if (puVar12 == local_58) goto LAB_0023695e;
        bVar26 = local_58 <= (ulong *)((long)puVar12 - (ulong)(uVar15 >> 3));
        uVar18 = (int)puVar12 - iVar14;
        if (bVar26) {
          uVar18 = uVar15 >> 3;
        }
        uVar15 = uVar15 + uVar18 * -8;
      }
      else {
        uVar18 = uVar15 >> 3;
        uVar15 = uVar15 & 7;
        bVar26 = true;
      }
      puVar12 = (ulong *)((long)puVar12 - (ulong)uVar18);
      uVar20 = *puVar12;
    }
    else {
LAB_0023695e:
      bVar26 = false;
    }
    puVar19 = (undefined1 *)((long)dst + lVar7);
    if ((puVar1 <= puVar19) || (!bVar26)) goto LAB_00236a63;
    bVar2 = *(byte *)((long)dt + uVar22 * 4 + 7);
    iVar16 = uVar15 + bVar2;
    uVar25 = (uVar20 << ((byte)uVar15 & 0x3f)) >> (-bVar2 & 0x3f);
    uVar23 = (ulong)(ushort)dt[uVar22 + 1];
    *puVar19 = *(undefined1 *)((long)dt + uVar22 * 4 + 6);
    bVar2 = *(byte *)((long)dt + uVar21 * 4 + 7);
    iVar17 = iVar16 + (uint)bVar2;
    uVar13 = (uVar20 << ((byte)iVar16 & 0x3f)) >> (-bVar2 & 0x3f);
    uVar24 = (ulong)(ushort)dt[uVar21 + 1];
    puVar19[1] = *(undefined1 *)((long)dt + uVar21 * 4 + 6);
    lVar8 = uVar25 * 4;
    bVar2 = *(byte *)((long)dt + uVar23 * 4 + lVar8 + 7);
    iVar16 = iVar17 + (uint)bVar2;
    uVar22 = ((uVar20 << ((byte)iVar17 & 0x3f)) >> (-bVar2 & 0x3f)) +
             (ulong)(ushort)dt[uVar25 + uVar23 + 1];
    puVar19[2] = *(undefined1 *)((long)dt + uVar23 * 4 + lVar8 + 6);
    lVar8 = uVar13 * 4;
    bVar2 = *(byte *)((long)dt + uVar24 * 4 + lVar8 + 7);
    uVar15 = iVar16 + (uint)bVar2;
    uVar21 = ((uVar20 << ((byte)iVar16 & 0x3f)) >> (-bVar2 & 0x3f)) +
             (ulong)(ushort)dt[uVar13 + uVar24 + 1];
    puVar19[3] = *(undefined1 *)((long)dt + uVar24 * 4 + lVar8 + 6);
    lVar7 = lVar7 + 4;
  } while( true );
LAB_00236dcf:
  puVar1 = (undefined1 *)((long)dst + (originalSize - 2));
  do {
    uVar23 = uVar21;
    lVar8 = lVar7;
    if (puVar1 < (undefined1 *)((long)dst + lVar8)) {
      return 0xffffffffffffffba;
    }
    FVar5 = dt[uVar22 + 1];
    bVar2 = *(byte *)((long)dt + uVar22 * 4 + 7);
    uVar15 = uVar15 + bVar2;
    uVar21 = uVar20 >> (-(char)uVar15 & 0x3fU);
    uVar18 = BIT_mask[bVar2];
    *(undefined1 *)((long)dst + lVar8) = *(undefined1 *)((long)dt + uVar22 * 4 + 6);
    uVar9 = uVar15;
    if (uVar15 < 0x41) {
      if (puVar12 < local_50) {
        if (puVar12 == local_58) goto LAB_00236e6c;
        uVar10 = (int)puVar12 - iVar14;
        if (local_58 <= (ulong *)((long)puVar12 - (ulong)(uVar15 >> 3))) {
          uVar10 = uVar15 >> 3;
        }
        uVar9 = uVar15 + uVar10 * -8;
      }
      else {
        uVar10 = uVar15 >> 3;
        uVar9 = uVar15 & 7;
      }
      puVar12 = (ulong *)((long)puVar12 - (ulong)uVar10);
      uVar20 = *puVar12;
    }
LAB_00236e6c:
    puVar19 = (undefined1 *)((long)dst + lVar8 + 1);
    if (0x40 < uVar15) {
      lVar7 = 2;
      goto LAB_00236f30;
    }
    if (puVar1 < puVar19) {
      return 0xffffffffffffffba;
    }
    FVar6 = dt[uVar23 + 1];
    bVar2 = *(byte *)((long)dt + uVar23 * 4 + 7);
    uVar9 = uVar9 + bVar2;
    uVar22 = uVar20 >> (-(char)uVar9 & 0x3fU);
    uVar10 = BIT_mask[bVar2];
    *puVar19 = *(undefined1 *)((long)dt + uVar23 * 4 + 6);
    uVar15 = uVar9;
    if (uVar9 < 0x41) {
      if (puVar12 < local_50) {
        if (puVar12 == local_58) goto LAB_00236f05;
        uVar11 = (int)puVar12 - iVar14;
        if (local_58 <= (ulong *)((long)puVar12 - (ulong)(uVar9 >> 3))) {
          uVar11 = uVar9 >> 3;
        }
        uVar15 = uVar9 + uVar11 * -8;
      }
      else {
        uVar11 = uVar9 >> 3;
        uVar15 = uVar9 & 7;
      }
      puVar12 = (ulong *)((long)puVar12 - (ulong)uVar11);
      uVar20 = *puVar12;
    }
LAB_00236f05:
    uVar23 = (ulong)((uint)uVar21 & uVar18) + (ulong)(ushort)FVar5;
    lVar7 = lVar8 + 2;
    uVar21 = (ulong)((uint)uVar22 & uVar10) + (ulong)(ushort)FVar6;
    uVar22 = uVar23;
  } while (uVar9 < 0x41);
  puVar19 = (undefined1 *)((long)dst + lVar8 + 2);
  lVar7 = 3;
LAB_00236f30:
  *puVar19 = *(undefined1 *)((long)dt + uVar23 * 4 + 6);
  return lVar7 + lVar8;
LAB_00236a63:
  puVar1 = (undefined1 *)((long)dst + (originalSize - 2));
  do {
    lVar8 = lVar7;
    if (puVar1 < (undefined1 *)((long)dst + lVar8)) {
      return 0xffffffffffffffba;
    }
    FVar5 = dt[uVar22 + 1];
    bVar2 = *(byte *)((long)dt + uVar22 * 4 + 7);
    uVar23 = uVar20 << ((byte)uVar15 & 0x3f);
    uVar15 = uVar15 + bVar2;
    *(undefined1 *)((long)dst + lVar8) = *(undefined1 *)((long)dt + uVar22 * 4 + 6);
    uVar18 = uVar15;
    if (uVar15 < 0x41) {
      if (puVar12 < local_50) {
        if (puVar12 == local_58) goto LAB_00236afd;
        uVar9 = (int)puVar12 - iVar14;
        if (local_58 <= (ulong *)((long)puVar12 - (ulong)(uVar15 >> 3))) {
          uVar9 = uVar15 >> 3;
        }
        uVar18 = uVar15 + uVar9 * -8;
      }
      else {
        uVar9 = uVar15 >> 3;
        uVar18 = uVar15 & 7;
      }
      puVar12 = (ulong *)((long)puVar12 - (ulong)uVar9);
      uVar20 = *puVar12;
    }
LAB_00236afd:
    puVar19 = (undefined1 *)((long)dst + lVar8 + 1);
    if (0x40 < uVar15) {
      lVar7 = 2;
      goto LAB_00236bd2;
    }
    if (puVar1 < puVar19) {
      return 0xffffffffffffffba;
    }
    FVar6 = dt[uVar21 + 1];
    bVar3 = *(byte *)((long)dt + uVar21 * 4 + 7);
    uVar13 = uVar20 << ((byte)uVar18 & 0x3f);
    uVar18 = uVar18 + bVar3;
    *puVar19 = *(undefined1 *)((long)dt + uVar21 * 4 + 6);
    uVar15 = uVar18;
    if (uVar18 < 0x41) {
      if (puVar12 < local_50) {
        if (puVar12 == local_58) goto LAB_00236ba2;
        uVar9 = (int)puVar12 - iVar14;
        if (local_58 <= (ulong *)((long)puVar12 - (ulong)(uVar18 >> 3))) {
          uVar9 = uVar18 >> 3;
        }
        uVar15 = uVar18 + uVar9 * -8;
      }
      else {
        uVar9 = uVar18 >> 3;
        uVar15 = uVar18 & 7;
      }
      puVar12 = (ulong *)((long)puVar12 - (ulong)uVar9);
      uVar20 = *puVar12;
    }
LAB_00236ba2:
    uVar22 = (uVar23 >> (-bVar2 & 0x3f)) + (ulong)(ushort)FVar5;
    uVar21 = (uVar13 >> (-bVar3 & 0x3f)) + (ulong)(ushort)FVar6;
    lVar7 = lVar8 + 2;
  } while (uVar18 < 0x41);
  puVar19 = (undefined1 *)((long)dst + lVar8 + 2);
  lVar7 = 3;
  uVar21 = uVar22;
LAB_00236bd2:
  *puVar19 = *(undefined1 *)((long)dt + uVar21 * 4 + 6);
  return lVar7 + lVar8;
}

Assistant:

size_t FSE_decompress_usingDTable(void* dst, size_t originalSize,
                            const void* cSrc, size_t cSrcSize,
                            const FSE_DTable* dt)
{
    const void* ptr = dt;
    const FSE_DTableHeader* DTableH = (const FSE_DTableHeader*)ptr;
    const U32 fastMode = DTableH->fastMode;

    /* select fast mode (static) */
    if (fastMode) return FSE_decompress_usingDTable_generic(dst, originalSize, cSrc, cSrcSize, dt, 1);
    return FSE_decompress_usingDTable_generic(dst, originalSize, cSrc, cSrcSize, dt, 0);
}